

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

aiNode * __thiscall
anon_unknown.dwarf_e36d82::ProcessSpatialStructure
          (anon_unknown_dwarf_e36d82 *this,aiNode *parent,IfcProduct *el,ConversionData *conv,
          vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
          *collect_openings)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  pointer pLVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 (*__src) [16];
  undefined1 auVar28 [16];
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar29;
  undefined1 auVar30 [16];
  iterator iVar31;
  pointer ppaVar32;
  pointer ppIVar33;
  pointer ppIVar34;
  undefined1 auVar35 [8];
  aiScene *paVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *pvVar40;
  uint uVar41;
  pointer __p;
  long lVar42;
  aiNode *this_00;
  long *plVar43;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var44;
  aiNode *paVar45;
  aiString *paVar46;
  aiMetadataEntry *__s;
  undefined4 *puVar47;
  IfcObjectPlacement *place;
  _Base_ptr p_Var48;
  LazyObject *this_01;
  Object *pOVar49;
  IfcSpatialStructureElement *pIVar50;
  IfcElement *pIVar51;
  __uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true> this_02;
  aiMatrix4x4t<float> *this_03;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var52;
  IfcObjectDefinition *pIVar53;
  __uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_> _Var54;
  aiNode **ppaVar55;
  IfcProductRepresentation *pIVar56;
  _Base_ptr p_Var57;
  IFC *pIVar58;
  IfcCartesianTransformationOperator *op;
  IfcRepresentationMap *pIVar59;
  IfcRepresentation *pIVar60;
  undefined7 extraout_var;
  undefined8 uVar61;
  reference ppaVar62;
  aiNode **__s_00;
  _Base_ptr p_Var63;
  undefined1 (*pauVar64) [16];
  aiNode *paVar65;
  undefined1 *puVar66;
  size_type *psVar67;
  undefined1 *puVar68;
  _Base_ptr p_Var69;
  ulong __n;
  undefined4 uVar70;
  undefined8 unaff_RBP;
  char *pcVar71;
  TempOpening *pTVar72;
  ulong uVar73;
  double *pdVar74;
  const_iterator __position;
  aiMatrix4x4t<double> *paVar75;
  TempOpening *open;
  size_t __n_00;
  _Rb_tree_color _Var76;
  aiString *paVar77;
  undefined8 *puVar78;
  const_iterator it;
  TempOpening *pTVar79;
  long lVar80;
  pointer pLVar81;
  _Head_base<0UL,_aiNode_*,_false> _Var82;
  bool bVar83;
  byte bVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar101;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd;
  vector<aiNode_*,_std::allocator<aiNode_*>_> subnodes;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd_aggr;
  Metadata properties;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  repr_ordered;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings_local;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  aiNode *ndnew;
  allocator<char> local_7d1;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_7d0;
  _Head_base<0UL,_aiNode_*,_false> local_7c8;
  _Rb_tree_color _Stack_7c0;
  undefined4 uStack_7bc;
  _Base_ptr local_7b0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> local_7a8;
  _Head_base<0UL,_aiNode_*,_false> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  aiNode **local_778;
  iterator iStack_770;
  aiNode **local_768;
  undefined8 local_758;
  undefined8 uStack_750;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_748;
  aiMatrix4x4 *local_718;
  undefined4 local_70c;
  double local_708;
  double dStack_700;
  undefined1 local_6f8 [16];
  _Base_ptr p_Stack_6e8;
  aiNode *paStack_6e0;
  aiNode *paStack_6d8;
  pointer local_6d0;
  double dStack_6c8;
  double dStack_6c0;
  double dStack_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double dStack_698;
  double dStack_690;
  double dStack_688;
  double local_680;
  vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
  local_670;
  undefined1 local_658 [16];
  undefined1 auStack_648 [16];
  undefined1 auStack_638 [8];
  aiScene *local_630;
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 auStack_5f8 [16];
  undefined1 auStack_5e8 [8];
  double local_5e0;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *local_5d8;
  double local_5d0;
  double *local_5c8;
  double local_5c0;
  double local_5b8;
  double dStack_5b0;
  undefined1 local_5a8 [16];
  aiNode *local_598;
  pointer ppaStack_590;
  pointer local_588;
  pointer ppaStack_580;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> local_578;
  ConversionData *local_560;
  _Base_ptr local_558 [2];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  _Base_ptr local_528;
  _Base_ptr local_520;
  _Base_ptr local_518;
  _Base_ptr local_510;
  undefined8 local_508;
  undefined1 auStack_500 [8];
  aiNode *local_4f8;
  _Base_ptr p_Stack_4f0;
  undefined8 local_4e8;
  _Base_ptr p_Stack_4e0;
  undefined8 local_4d8;
  char acStack_4d0 [8];
  double local_4c8;
  double dStack_4c0;
  pointer local_4b8;
  pointer ppaStack_4b0;
  double local_4a8;
  double dStack_4a0;
  double local_498;
  char *pcStack_490;
  double local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  char local_468 [4];
  char acStack_464 [4];
  char acStack_460 [4];
  char acStack_45c [4];
  char local_458 [4];
  char acStack_454 [4];
  char acStack_450 [4];
  char acStack_44c [4];
  char local_448 [4];
  char acStack_444 [4];
  char acStack_440 [4];
  char acStack_43c [4];
  undefined1 local_438 [24];
  double dStack_420;
  undefined1 auStack_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 auStack_3d8 [16];
  undefined1 auStack_3c8 [920];
  
  dStack_420 = (double)local_438._16_8_;
  auStack_648._8_8_ = auStack_648._0_8_;
  bVar84 = 0;
  paVar45 = *(aiNode **)&(el->super_IfcObject).field_0x18;
  pcVar71 = *(char **)&el[1].super_IfcObject.field_0x28;
  if ((*pcVar71 == '\x01') &&
     (lVar42 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcSpace::typeinfo,0xffffffffffffffff),
     lVar42 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4f535b);
    pcVar71 = *(char **)&el[1].super_IfcObject.field_0x28;
    uVar70 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  }
  else {
    uVar70 = 0;
  }
  if ((pcVar71[2] == '\x01') &&
     (lVar42 = __dynamic_cast((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + -4
                              ,&Assimp::STEP::Object::typeinfo,
                              &Assimp::IFC::Schema_2x3::IfcAnnotation::typeinfo,0xffffffffffffffff),
     lVar42 != 0)) {
    Assimp::LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x4f53af);
    return (aiNode *)0x0;
  }
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_538,
             *(char **)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 0xc),
             (allocator<char> *)&local_798);
  lVar42 = std::__cxx11::string::append((char *)local_538);
  puVar1 = (undefined1 *)&local_748._M_impl.super__Rb_tree_header._M_header._M_parent;
  _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       (tuple<aiNode_*,_std::default_delete<aiNode>_>)(lVar42 + 0x10);
  if ((_Head_base<0UL,_aiNode_*,_false>)
      *(_Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_> *)lVar42 ==
      (_Head_base<0UL,_aiNode_*,_false>)
      _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl) {
    local_748._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)
          _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
    local_748._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(lVar42 + 0x18);
    local_748._M_impl._0_8_ = puVar1;
  }
  else {
    local_748._M_impl.super__Rb_tree_header._M_header._M_parent =
         *(_Base_ptr *)
          _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
          super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
    local_748._M_impl._0_8_ =
         (_Head_base<0UL,_aiNode_*,_false>)
         *(_Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_> *)lVar42;
  }
  local_748._M_impl.super__Rb_tree_header._M_header._0_8_ = *(undefined8 *)(lVar42 + 8);
  *(tuple<aiNode_*,_std::default_delete<aiNode>_> *)lVar42 =
       _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
       super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
  *(undefined8 *)(lVar42 + 8) = 0;
  *(undefined1 *)(lVar42 + 0x10) = 0;
  if ((parent->mName).data[0x54] == '\x01') {
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    lVar42 = *(long *)((parent->mName).data + 0x34);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_798,lVar42,*(long *)((parent->mName).data + 0x3c) + lVar42);
  }
  else {
    local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"Unnamed","");
  }
  plVar43 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_748,(ulong)local_798._M_dataplus._M_p);
  local_658._0_8_ = auStack_648;
  pauVar64 = (undefined1 (*) [16])(plVar43 + 2);
  if ((undefined1 (*) [16])*plVar43 == pauVar64) {
    auStack_648 = *pauVar64;
  }
  else {
    auStack_648._0_8_ = *(long *)*pauVar64;
    local_658._0_8_ = (undefined1 (*) [16])*plVar43;
  }
  local_658._8_8_ = plVar43[1];
  *plVar43 = (long)pauVar64;
  plVar43[1] = 0;
  *(undefined1 *)(plVar43 + 2) = 0;
  local_70c = uVar70;
  plVar43 = (long *)std::__cxx11::string::append(local_658);
  local_6f8._0_8_ = &p_Stack_6e8;
  paVar65 = (aiNode *)(plVar43 + 2);
  if ((aiNode *)*plVar43 == paVar65) {
    p_Stack_6e8 = *(_Base_ptr *)&paVar65->mName;
    paStack_6e0 = (aiNode *)plVar43[3];
  }
  else {
    p_Stack_6e8 = *(_Base_ptr *)&paVar65->mName;
    local_6f8._0_8_ = (aiNode *)*plVar43;
  }
  local_6f8._8_8_ = plVar43[1];
  *plVar43 = (long)paVar65;
  plVar43[1] = 0;
  *(undefined1 *)(plVar43 + 2) = 0;
  local_7c8._M_head_impl = paVar45;
  local_560 = conv;
  plVar43 = (long *)std::__cxx11::string::_M_append
                              (local_6f8,*(ulong *)((parent->mName).data + 0xc));
  pauVar64 = (undefined1 (*) [16])(plVar43 + 2);
  if ((undefined1 (*) [16])*plVar43 == pauVar64) {
    unique0x100047a2 = *pauVar64;
    __src = (undefined1 (*) [16])(local_438 + 0x10);
  }
  else {
    local_438._16_8_ = *(long *)*pauVar64;
    __src = (undefined1 (*) [16])*plVar43;
  }
  uVar73 = plVar43[1];
  local_438._8_8_ = uVar73;
  local_438._0_8_ = __src;
  *plVar43 = (long)pauVar64;
  plVar43[1] = 0;
  *(undefined1 *)(plVar43 + 2) = 0;
  if (uVar73 < 0x400) {
    (this_00->mName).length = (ai_uint32)uVar73;
    memcpy((this_00->mName).data,__src,uVar73);
    (this_00->mName).data[uVar73] = '\0';
  }
  if (__src != (undefined1 (*) [16])(local_438 + 0x10)) {
    operator_delete(__src,local_438._16_8_ + 1);
  }
  _Var82._M_head_impl = local_7c8._M_head_impl;
  if ((aiNode *)local_6f8._0_8_ != (aiNode *)&p_Stack_6e8) {
    operator_delete((void *)local_6f8._0_8_,(ulong)((long)&p_Stack_6e8->_M_color + 1));
  }
  if ((pointer)local_658._0_8_ != (pointer)auStack_648) {
    operator_delete((void *)local_658._0_8_,(ulong)((long)(IfcSolidModel **)auStack_648._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_748._M_impl._0_8_ != puVar1) {
    operator_delete((void *)local_748._M_impl._0_8_,
                    (ulong)((long)&(local_748._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  pcVar71 = ((_Var82._M_head_impl)->mName).data + 0xbc;
  if ((_Base_ptr *)local_538._0_8_ != &local_528) {
    operator_delete((void *)local_538._0_8_,(ulong)((long)&local_528->_M_color + 1));
  }
  this_00->mParent = (aiNode *)this;
  local_5d8 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
               *)&el[1].super_IfcObject.field_0x40;
  local_438._0_8_ =
       *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::_M_insert_unique<unsigned_long>
            ((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              *)local_5d8,(unsigned_long *)local_438);
  local_438._0_8_ =
       *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  pVar101 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)pcVar71,(key_type_conflict1 *)local_438);
  _Var44 = pVar101.first._M_node;
  if (_Var44._M_node != (_Rb_tree_node_base *)(((_Var82._M_head_impl)->mName).data + 0xc4)) {
    paStack_6e0 = (aiNode *)(local_6f8 + 8);
    local_6f8._8_8_ = local_6f8._8_8_ & 0xffffffff00000000;
    p_Stack_6e8 = (_Base_ptr)0x0;
    local_6d0 = (pointer)0x0;
    paStack_6d8 = paStack_6e0;
    if (_Var44._M_node == pVar101.second._M_node._M_node) {
      ProcessMetadata((uint64_t)_Var44._M_node[1]._M_parent,(ConversionData *)el,
                      (Metadata *)local_6f8);
    }
    else {
      do {
        ProcessMetadata((uint64_t)_Var44._M_node[1]._M_parent,(ConversionData *)el,
                        (Metadata *)local_6f8);
        _Var44._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var44._M_node);
      } while (_Var44._M_node != pVar101.second._M_node._M_node);
    }
    ppaVar32 = local_6d0;
    if (local_6d0 != (pointer)0x0) {
      _Var76 = (_Rb_tree_color)local_6d0;
      local_758 = pcVar71;
      if (_Var76 == _S_red) {
        local_7c8._M_head_impl = (aiNode *)0x0;
      }
      else {
        paVar45 = (aiNode *)operator_new(0x18);
        (paVar45->mName).length = _Var76;
        uVar73 = (ulong)ppaVar32 & 0xffffffff;
        paVar46 = (aiString *)operator_new__(uVar73 * 0x404);
        paVar77 = paVar46;
        local_7c8._M_head_impl = paVar45;
        do {
          paVar77->length = 0;
          paVar77->data[0] = '\0';
          memset(paVar77->data + 1,0x1b,0x3ff);
          _Var82._M_head_impl = local_7c8._M_head_impl;
          paVar77 = paVar77 + 1;
        } while (paVar77 != paVar46 + uVar73);
        *(aiString **)(((local_7c8._M_head_impl)->mName).data + 4) = paVar46;
        __s = (aiMetadataEntry *)operator_new__(uVar73 << 4);
        memset(__s,0,uVar73 << 4);
        *(aiMetadataEntry **)(((_Var82._M_head_impl)->mName).data + 0xc) = __s;
      }
      if (paStack_6e0 != (aiNode *)(local_6f8 + 8)) {
        _Var76 = _S_red;
        paVar45 = paStack_6e0;
        do {
          uVar73 = *(ulong *)((paVar45->mName).data + 0x44);
          __n_00 = uVar73 & 0xffffffff;
          if ((uVar73 & 0xfffffc00) != 0) {
            __n_00 = 0x3ff;
          }
          local_438._0_4_ = (uint)__n_00;
          memcpy(local_438 + 4,*(void **)((paVar45->mName).data + 0x3c),__n_00);
          local_438[__n_00 + 4] = 0;
          if ((_Var76 < ((local_7c8._M_head_impl)->mName).length) &&
             (uVar73 = *(ulong *)((paVar45->mName).data + 0x24), uVar73 != 0)) {
            if (uVar73 < 0x400) {
              paVar46 = *(aiString **)(((local_7c8._M_head_impl)->mName).data + 4);
              paVar77 = paVar46 + _Var76;
              paVar77->length = (ai_uint32)uVar73;
              memcpy(paVar77->data,*(void **)((paVar45->mName).data + 0x1c),uVar73);
              paVar46[_Var76].data[uVar73] = '\0';
            }
            _Var82._M_head_impl = local_7c8._M_head_impl;
            (*(aiMetadataEntry **)(((local_7c8._M_head_impl)->mName).data + 0xc))[_Var76].mType =
                 AI_AISTRING;
            puVar47 = (undefined4 *)operator_new(0x404);
            if (0x3fe < (uint)__n_00) {
              __n_00 = 0x3ff;
            }
            *puVar47 = (int)__n_00;
            memcpy(puVar47 + 1,local_438 + 4,__n_00);
            *(undefined1 *)((long)puVar47 + __n_00 + 4) = 0;
            (*(aiMetadataEntry **)(((_Var82._M_head_impl)->mName).data + 0xc))[_Var76].mData =
                 puVar47;
          }
          _Var76 = _Var76 + _S_black;
          paVar45 = (aiNode *)std::_Rb_tree_increment((_Rb_tree_node_base *)paVar45);
        } while (paVar45 != (aiNode *)(local_6f8 + 8));
      }
      this_00->mMetaData = (aiMetadata *)local_7c8._M_head_impl;
      pcVar71 = local_758;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_6f8);
  }
  if ((parent->mName).data[0xe4] == '\x01') {
    place = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectPlacement>
                      (*(LazyObject **)((parent->mName).data + 0xdc));
    ResolveObjectPlacement(&this_00->mTransformation,place,(ConversionData *)el);
  }
  local_578.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_578.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578.super__Vector_base<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488 = 0.0;
  dStack_480 = 0.0;
  local_478 = 0.0;
  dStack_470 = 0.0;
  local_4a8 = 0.0;
  dStack_4a0 = 0.0;
  local_498 = 0.0;
  pcStack_490 = (char *)0x0;
  local_4c8 = 0.0;
  dStack_4c0 = 0.0;
  local_4b8 = (pointer)0x0;
  ppaStack_4b0 = (pointer)0x0;
  local_768 = (aiNode **)0x0;
  local_778 = (aiNode **)0x0;
  iStack_770._M_current = (aiNode **)0x0;
  local_438._0_8_ =
       *(undefined8 *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
  pVar101 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                           *)pcVar71,(key_type_conflict1 *)local_438);
  if (pVar101.first._M_node._M_node != pVar101.second._M_node._M_node) {
    local_7b0 = (_Base_ptr)&el[1].super_IfcObject.field_0x48;
    local_718 = &this_00->mTransformation;
    local_5d0 = 0.0;
    local_508 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
                0x3ff0000000000000;
    auStack_500 = (undefined1  [8])0x0;
    local_4e8 = (_Base_ptr)0x3ff0000000000000;
    p_Stack_4e0 = (_Base_ptr)0x0;
    local_4d8 = 1.0;
    acStack_4d0[0] = '\0';
    acStack_4d0[1] = '\0';
    acStack_4d0[2] = '\0';
    acStack_4d0[3] = '\0';
    acStack_4d0[4] = '\0';
    acStack_4d0[5] = '\0';
    acStack_4d0[6] = '\0';
    acStack_4d0[7] = '\0';
    local_4f8 = (aiNode *)0x3ff0000000000000;
    p_Stack_4f0 = (_Base_ptr)0x0;
    pVar29 = pVar101;
    do {
      local_7d0 = pVar29.second._M_node;
      local_7a8 = pVar29.first._M_node;
      _Var44 = pVar101.second._M_node;
      p_Var48 = *(_Base_ptr *)&el[1].super_IfcObject.field_0x50;
      p_Var63 = pVar101.first._M_node._M_node[1]._M_parent;
      p_Var57 = local_7b0;
      if (p_Var48 == (_Base_ptr)0x0) {
LAB_004f5b52:
        this_01 = Assimp::STEP::DB::MustGetObject
                            (*(DB **)&(el->super_IfcObject).field_0x18,(uint64_t)p_Var63);
        pOVar49 = Assimp::STEP::LazyObject::operator*(this_01);
        lVar42 = __dynamic_cast(pOVar49,&Assimp::STEP::Object::typeinfo,
                                &Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::
                                 typeinfo,0xffffffffffffffff);
        if (lVar42 == 0) {
          pOVar49 = Assimp::STEP::LazyObject::operator*(this_01);
          lVar42 = __dynamic_cast(pOVar49,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelVoidsElement::typeinfo,
                                  0xffffffffffffffff);
          pVar29.second._M_node = local_7d0._M_node;
          pVar29.first._M_node = local_7a8._M_node;
          if (lVar42 != 0) {
            pIVar51 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcElement>
                                (*(LazyObject **)(lVar42 + 0xb8));
            pVar29.second._M_node = local_7d0._M_node;
            pVar29.first._M_node = local_7a8._M_node;
            if (*(long *)(&(pIVar51->super_IfcProduct).super_IfcObject.field_0x8 +
                         *(long *)(*(long *)&(pIVar51->super_IfcProduct).super_IfcObject + -0x18))
                == *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))
            {
              paVar45 = (aiNode *)
                        Assimp::STEP::LazyObject::
                        To<Assimp::IFC::Schema_2x3::IfcFeatureElementSubtraction>
                                  (*(LazyObject **)(lVar42 + 0xc0));
              this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
              super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>)operator_new(0x478);
              aiNode::aiNode((aiNode *)
                             this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                             _M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                             super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
              *(undefined4 *)
               this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
               super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
               super__Head_base<0UL,_aiNode_*,_false>._M_head_impl = 0x10;
              builtin_strncpy((char *)((long)this_02.
                                             super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                             .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                      4),"$RelVoid",8);
              builtin_strncpy((char *)((long)this_02.
                                             super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                             .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                      0xc),"sElement",8);
              *(char *)((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                              _M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x14) = '\0';
              *(aiNode **)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x448) = this_00;
              fVar6 = local_718->a2;
              uVar61 = *(undefined8 *)&local_718->a3;
              uVar22 = *(undefined8 *)&local_718->b1;
              uVar23 = *(undefined8 *)&local_718->b3;
              uVar24 = *(undefined8 *)&local_718->c1;
              uVar25 = *(undefined8 *)&local_718->c3;
              uVar26 = *(undefined8 *)&local_718->d1;
              uVar27 = *(undefined8 *)&local_718->d3;
              ((aiMatrix4x4 *)
              ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a1 =
                   local_718->a1;
              ((aiMatrix4x4 *)
              ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a2 = fVar6;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = uVar61;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) = uVar22;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = uVar23;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = uVar24;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = uVar25;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = uVar26;
              *(undefined8 *)
               ((long)this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = uVar27;
              local_658 = ZEXT816(0);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = auStack_648._8_8_;
              auStack_648 = auVar28 << 0x40;
              local_748._M_impl._0_8_ =
                   this_02.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
              paVar45 = ProcessSpatialStructure
                                  ((anon_unknown_dwarf_e36d82 *)
                                   this_02.
                                   super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,paVar45,el,
                                   (ConversionData *)local_658,collect_openings);
              uVar61 = local_748._M_impl._0_8_;
              _Var44._M_node = local_7d0._M_node;
              if (paVar45 != (aiNode *)0x0) {
                *(uint *)(local_748._M_impl._0_8_ + 0x450) = 1;
                ppaVar55 = (aiNode **)operator_new__(8);
                _Var44._M_node = local_7d0._M_node;
                *(aiNode ***)(uVar61 + 0x458) = ppaVar55;
                *ppaVar55 = paVar45;
                if (local_658._8_8_ != local_658._0_8_) {
                  pTVar72 = (TempOpening *)local_658._8_8_;
                  pTVar79 = (TempOpening *)local_658._0_8_;
                  if (((ulong)local_5d0 & 1) == 0) {
                    local_6f8._0_8_ = *(undefined8 *)local_718;
                    local_6f8._8_8_ = *(undefined8 *)&local_718->a3;
                    p_Stack_6e8 = *(_Base_ptr *)&local_718->b1;
                    paStack_6e0 = *(aiNode **)&local_718->b3;
                    paStack_6d8 = *(aiNode **)&local_718->c1;
                    local_6d0 = *(pointer *)&local_718->c3;
                    dStack_6c8 = *(double *)&local_718->d1;
                    dStack_6c0 = *(double *)&local_718->d3;
                    this_03 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_6f8);
                    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(this_03);
                    local_4f8 = (aiNode *)local_438._0_8_;
                    p_Stack_4f0 = (_Base_ptr)0x0;
                    local_4e8 = (_Base_ptr)auStack_418._8_8_;
                    p_Stack_4e0 = (_Base_ptr)0x0;
                    ppaVar55 = (aiNode **)(local_438 + 8);
                    local_478 = dStack_420;
                    dStack_470 = (double)auStack_418._0_8_;
                    local_488 = (double)local_438._8_8_;
                    dStack_480 = (double)local_438._16_8_;
                    local_4a8 = (double)local_408._0_8_;
                    dStack_4a0 = (double)local_408._8_8_;
                    local_498 = (double)local_3f8._0_8_;
                    pcStack_490 = (char *)local_3f8._8_8_;
                    local_508 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 *)local_3e8._0_8_;
                    auStack_500 = (undefined1  [8])0x0;
                    local_4c8 = (double)local_3e8._8_8_;
                    dStack_4c0 = (double)auStack_3d8._0_8_;
                    local_4b8 = (pointer)auStack_3d8._8_8_;
                    ppaStack_4b0 = (pointer)auStack_3c8._0_8_;
                    local_4d8 = (double)auStack_3c8._8_8_;
                    acStack_4d0[0] = '\0';
                    acStack_4d0[1] = '\0';
                    acStack_4d0[2] = '\0';
                    acStack_4d0[3] = '\0';
                    acStack_4d0[4] = '\0';
                    acStack_4d0[5] = '\0';
                    acStack_4d0[6] = '\0';
                    acStack_4d0[7] = '\0';
                    pTVar72 = (TempOpening *)local_658._8_8_;
                    pTVar79 = (TempOpening *)local_658._0_8_;
                  }
                  dVar5 = local_4d8;
                  p_Var63 = local_4e8;
                  pvVar40 = local_508;
                  local_5d0 = (double)CONCAT71((int7)((ulong)ppaVar55 >> 8),1);
                  if (pTVar79 != pTVar72) {
                    local_7c8._M_head_impl = local_4f8;
                    _Stack_7c0 = (_Rb_tree_color)local_4f8;
                    uStack_7bc = local_4f8._4_4_;
                    local_448[0] = (char)local_4e8;
                    local_448[1] = local_4e8._1_1_;
                    local_448[2] = local_4e8._2_1_;
                    local_448[3] = local_4e8._3_1_;
                    acStack_444[0] = local_4e8._4_1_;
                    acStack_444[1] = local_4e8._5_1_;
                    acStack_444[2] = local_4e8._6_1_;
                    acStack_444[3] = local_4e8._7_1_;
                    acStack_440[0] = (char)local_4e8;
                    acStack_440[1] = local_4e8._1_1_;
                    acStack_440[2] = local_4e8._2_1_;
                    acStack_440[3] = local_4e8._3_1_;
                    acStack_43c[0] = local_4e8._4_1_;
                    acStack_43c[1] = local_4e8._5_1_;
                    acStack_43c[2] = local_4e8._6_1_;
                    acStack_43c[3] = local_4e8._7_1_;
                    local_458[0] = (char)local_508;
                    local_458[1] = local_508._1_1_;
                    local_458[2] = local_508._2_1_;
                    local_458[3] = local_508._3_1_;
                    acStack_454[0] = local_508._4_1_;
                    acStack_454[1] = local_508._5_1_;
                    acStack_454[2] = local_508._6_1_;
                    acStack_454[3] = local_508._7_1_;
                    acStack_450[0] = (char)local_508;
                    acStack_450[1] = local_508._1_1_;
                    acStack_450[2] = local_508._2_1_;
                    acStack_450[3] = local_508._3_1_;
                    acStack_44c[0] = local_508._4_1_;
                    acStack_44c[1] = local_508._5_1_;
                    acStack_44c[2] = local_508._6_1_;
                    acStack_44c[3] = local_508._7_1_;
                    local_468[0] = (char)local_4d8;
                    local_468[1] = local_4d8._1_1_;
                    local_468[2] = local_4d8._2_1_;
                    local_468[3] = local_4d8._3_1_;
                    acStack_464[0] = local_4d8._4_1_;
                    acStack_464[1] = local_4d8._5_1_;
                    acStack_464[2] = local_4d8._6_1_;
                    acStack_464[3] = local_4d8._7_1_;
                    acStack_460[0] = (char)local_4d8;
                    acStack_460[1] = local_4d8._1_1_;
                    acStack_460[2] = local_4d8._2_1_;
                    acStack_460[3] = local_4d8._3_1_;
                    acStack_45c[0] = local_4d8._4_1_;
                    acStack_45c[1] = local_4d8._5_1_;
                    acStack_45c[2] = local_4d8._6_1_;
                    acStack_45c[3] = local_4d8._7_1_;
                    local_508 = pvVar40;
                    local_4e8 = p_Var63;
                    local_4d8 = dVar5;
                    do {
                      aiMatrix4x4t::operator_cast_to_aiMatrix4x4t
                                (&(**(aiNode ***)(local_748._M_impl._0_8_ + 0x458))->mTransformation
                                );
                      local_758 = pcStack_490;
                      uStack_750 = (double)local_3e8._0_8_;
                      local_598 = paStack_6d8;
                      ppaStack_590 = local_6d0;
                      dVar5 = dStack_690 * local_478 +
                              dStack_6b0 * dStack_480 +
                              (double)local_6f8._8_8_ * (double)CONCAT44(uStack_7bc,_Stack_7c0) +
                              local_488 * (double)local_6d0;
                      local_588 = local_4b8;
                      ppaStack_580 = ppaStack_4b0;
                      local_438._8_4_ = SUB84(dVar5,0);
                      local_438._0_8_ =
                           dStack_698 * local_478 +
                           dStack_6b8 * dStack_480 +
                           (double)local_6f8._0_8_ * (double)local_7c8._M_head_impl +
                           local_488 * (double)paStack_6d8;
                      local_438._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      local_708 = dStack_6c8;
                      dStack_700 = dStack_6c0;
                      local_5a8._8_4_ = SUB84(dStack_4c0 * (double)paStack_6e0,0);
                      local_5a8._0_8_ = dStack_4c0 * (double)p_Stack_6e8;
                      local_5a8._12_4_ = (int)((ulong)(dStack_4c0 * (double)paStack_6e0) >> 0x20);
                      dVar5 = local_478 * local_680 +
                              dStack_480 * dStack_6a0 +
                              (double)paStack_6e0 * (double)CONCAT44(uStack_7bc,_Stack_7c0) +
                              local_488 * dStack_6c0;
                      unique0x10002bec = SUB84(dVar5,0);
                      local_438._16_8_ =
                           local_478 * dStack_688 +
                           dStack_480 * local_6a8 +
                           (double)p_Stack_6e8 * (double)local_7c8._M_head_impl +
                           local_488 * dStack_6c8;
                      unique0x10002bf0 = (int)((ulong)dVar5 >> 0x20);
                      dVar5 = dStack_690 * dStack_4a0 +
                              dStack_6b0 * local_4a8 +
                              (double)local_6f8._8_8_ * dStack_470 +
                              (double)CONCAT44(acStack_43c,acStack_440) * (double)local_6d0;
                      auStack_418._8_4_ = SUB84(dVar5,0);
                      auStack_418._0_8_ =
                           dStack_698 * dStack_4a0 +
                           dStack_6b8 * local_4a8 +
                           (double)local_6f8._0_8_ * dStack_470 +
                           (double)CONCAT44(acStack_444,local_448) * (double)paStack_6d8;
                      auStack_418._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      dVar5 = dStack_4a0 * local_680 +
                              local_4a8 * dStack_6a0 +
                              dStack_470 * (double)paStack_6e0 +
                              (double)CONCAT44(acStack_43c,acStack_440) * dStack_6c0;
                      local_408._8_4_ = SUB84(dVar5,0);
                      local_408._0_8_ =
                           dStack_4a0 * dStack_688 +
                           local_4a8 * local_6a8 +
                           dStack_470 * (double)p_Stack_6e8 +
                           (double)CONCAT44(acStack_444,local_448) * dStack_6c8;
                      local_408._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      dVar5 = dStack_690 * local_4c8 +
                              dStack_6b0 * (double)CONCAT44(acStack_44c,acStack_450) +
                              (double)local_6f8._8_8_ * local_498 +
                              (double)local_6d0 * (double)pcStack_490;
                      local_3f8._8_4_ = SUB84(dVar5,0);
                      local_3f8._0_8_ =
                           dStack_698 * local_4c8 +
                           dStack_6b8 * (double)CONCAT44(acStack_454,local_458) +
                           (double)local_6f8._0_8_ * local_498 +
                           (double)paStack_6d8 * (double)pcStack_490;
                      local_3f8._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      dVar5 = local_4c8 * local_680 +
                              dStack_6a0 * (double)CONCAT44(acStack_44c,acStack_450) +
                              local_498 * (double)paStack_6e0 + (double)pcStack_490 * dStack_6c0;
                      local_3e8._8_4_ = SUB84(dVar5,0);
                      local_3e8._0_8_ =
                           local_4c8 * dStack_688 +
                           local_6a8 * (double)CONCAT44(acStack_454,local_458) +
                           local_498 * (double)p_Stack_6e8 + (double)pcStack_490 * dStack_6c8;
                      local_3e8._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      dVar5 = dStack_690 * (double)CONCAT44(acStack_45c,acStack_460) +
                              dStack_6b0 * (double)ppaStack_4b0 +
                              (double)local_6f8._8_8_ * dStack_4c0 +
                              (double)local_6d0 * (double)local_4b8;
                      auStack_3d8._8_4_ = SUB84(dVar5,0);
                      auStack_3d8._0_8_ =
                           dStack_698 * (double)CONCAT44(acStack_464,local_468) +
                           dStack_6b8 * (double)ppaStack_4b0 +
                           (double)local_6f8._0_8_ * dStack_4c0 +
                           (double)paStack_6d8 * (double)local_4b8;
                      auStack_3d8._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      dVar5 = local_680 * (double)CONCAT44(acStack_45c,acStack_460) +
                              (double)ppaStack_4b0 * dStack_6a0 +
                              (double)local_5a8._8_8_ + (double)local_4b8 * dStack_6c0;
                      auStack_3c8._8_4_ = SUB84(dVar5,0);
                      auStack_3c8._0_8_ =
                           dStack_688 * (double)CONCAT44(acStack_464,local_468) +
                           (double)ppaStack_4b0 * local_6a8 +
                           dStack_4c0 * (double)p_Stack_6e8 + (double)local_4b8 * dStack_6c8;
                      auStack_3c8._12_4_ = (int)((ulong)dVar5 >> 0x20);
                      Assimp::IFC::TempOpening::Transform(pTVar79,(IfcMatrix4 *)local_438);
                      std::
                      vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
                      push_back(&local_578,pTVar79);
                      pTVar79 = pTVar79 + 1;
                    } while (pTVar79 != pTVar72);
                  }
                }
                local_438._0_8_ = local_748._M_impl._0_8_;
                local_748._M_impl._0_8_ = (aiNode *)0x0;
                std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                          ((vector<aiNode*,std::allocator<aiNode*>> *)&local_778,
                           (aiNode **)local_438);
              }
              std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::
              ~vector((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *
                      )local_658);
              std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                        ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_748);
              pVar29.second._M_node = local_7d0._M_node;
              pVar29.first._M_node = local_7a8._M_node;
            }
          }
        }
        else {
          pIVar50 = Assimp::STEP::LazyObject::
                    To<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                              (*(LazyObject **)(lVar42 + 0xd0));
          pVar29.second._M_node = local_7d0._M_node;
          pVar29.first._M_node = local_7a8._M_node;
          if (*(long *)(&(pIVar50->super_IfcProduct).super_IfcObject.field_0x8 +
                       *(long *)(*(long *)&(pIVar50->super_IfcProduct).super_IfcObject + -0x18)) ==
              *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4)) {
            puVar2 = *(undefined8 **)(lVar42 + 0xc0);
            for (puVar78 = *(undefined8 **)(lVar42 + 0xb8);
                pVar29.second._M_node = local_7d0._M_node, pVar29.first._M_node = local_7a8._M_node,
                _Var44._M_node = local_7d0._M_node, puVar78 != puVar2; puVar78 = puVar78 + 1) {
              paVar45 = (aiNode *)
                        Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProduct>
                                  ((LazyObject *)*puVar78);
              lVar42 = __dynamic_cast((paVar45->mName).data +
                                      *(long *)(*(long *)&paVar45->mName + -0x18) + -4,
                                      &Assimp::STEP::Object::typeinfo,
                                      &Assimp::IFC::Schema_2x3::IfcOpeningElement::typeinfo);
              if (lVar42 == 0) {
                paVar45 = ProcessSpatialStructure
                                    ((anon_unknown_dwarf_e36d82 *)this_00,paVar45,el,
                                     (ConversionData *)0x0,collect_openings);
                local_438._0_8_ = paVar45;
                if (paVar45 != (aiNode *)0x0) {
                  if (iStack_770._M_current == local_768) {
                    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
                              ((vector<aiNode*,std::allocator<aiNode*>> *)&local_778,iStack_770,
                               (aiNode **)local_438);
                  }
                  else {
                    *iStack_770._M_current = paVar45;
                    iStack_770._M_current = iStack_770._M_current + 1;
                  }
                }
              }
            }
          }
        }
      }
      else {
        do {
          if (*(_Base_ptr *)(p_Var48 + 1) >= p_Var63) {
            p_Var57 = p_Var48;
          }
          p_Var48 = (&p_Var48->_M_left)[*(_Base_ptr *)(p_Var48 + 1) < p_Var63];
        } while (p_Var48 != (_Base_ptr)0x0);
        if ((p_Var57 == local_7b0) || (p_Var63 < *(_Base_ptr *)(p_Var57 + 1))) goto LAB_004f5b52;
      }
      local_7d0 = pVar29.second._M_node;
      local_7a8 = pVar29.first._M_node;
      _Var52._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar101.first._M_node._M_node);
      pVar29.second._M_node = local_7d0._M_node;
      pVar29.first._M_node = local_7a8._M_node;
      pVar101.second._M_node = _Var44._M_node;
      pVar101.first._M_node = _Var52._M_node;
    } while (_Var52._M_node != _Var44._M_node);
    if (local_7a8._M_node != _Var44._M_node) {
      puVar1 = &el[1].super_IfcObject.field_0x48;
      _Var52._M_node = local_7a8._M_node;
      do {
        puVar66 = *(undefined1 **)&el[1].super_IfcObject.field_0x50;
        p_Var63 = _Var52._M_node[1]._M_parent;
        puVar68 = puVar1;
        local_7a8._M_node = _Var52._M_node;
        if (puVar66 == (undefined1 *)0x0) {
LAB_004f63b4:
          lVar42 = *(long *)&(el->super_IfcObject).field_0x18;
          lVar80 = *(long *)(lVar42 + 0x70);
          lVar42 = lVar42 + 0x68;
          do {
            bVar83 = *(_Base_ptr *)(lVar80 + 0x20) < p_Var63;
            if (!bVar83) {
              lVar42 = lVar80;
            }
            lVar80 = *(long *)(lVar80 + 0x10 + (ulong)bVar83 * 8);
          } while (lVar80 != 0);
          pOVar49 = Assimp::STEP::LazyObject::operator*(*(LazyObject **)(lVar42 + 0x28));
          lVar42 = __dynamic_cast(pOVar49,&Assimp::STEP::Object::typeinfo,
                                  &Assimp::IFC::Schema_2x3::IfcRelAggregates::typeinfo,
                                  0xffffffffffffffff);
          if ((lVar42 != 0) &&
             (pIVar53 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  (*(LazyObject **)(lVar42 + 0xa8)),
             *(long *)((pIVar53->super_IfcRoot).
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper
                       [-3] + (long)&(pIVar53->super_IfcRoot).
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     aux_is_derived.super__Base_bitset<1UL>) ==
             *(long *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4))) {
            _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                 (tuple<aiNode_*,_std::default_delete<aiNode>_>)operator_new(0x478);
            aiNode::aiNode((aiNode *)
                           _Var54._M_t.
                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                           super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
            *(undefined4 *)
             _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
             super__Head_base<0UL,_aiNode_*,_false>._M_head_impl = 0xe;
            builtin_strncpy((char *)((long)_Var54._M_t.
                                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                           .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 4)
                            ,"$RelAggr",8);
            builtin_strncpy((char *)((long)_Var54._M_t.
                                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                           .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 10
                                    ),"gregates",8);
            *(char *)((long)_Var54._M_t.
                            super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                            super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x12) = '\0';
            *(aiNode **)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x448) = this_00;
            fVar6 = local_718->a2;
            uVar61 = *(undefined8 *)&local_718->a3;
            uVar22 = *(undefined8 *)&local_718->b1;
            uVar23 = *(undefined8 *)&local_718->b3;
            uVar24 = *(undefined8 *)&local_718->c1;
            uVar25 = *(undefined8 *)&local_718->c3;
            uVar26 = *(undefined8 *)&local_718->d1;
            uVar27 = *(undefined8 *)&local_718->d3;
            ((aiMatrix4x4 *)
            ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a1 = local_718->a1
            ;
            ((aiMatrix4x4 *)
            ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x404))->a2 = fVar6;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x40c) = uVar61;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x414) = uVar22;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x41c) = uVar23;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x424) = uVar24;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x42c) = uVar25;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x434) = uVar26;
            *(undefined8 *)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x43c) = uVar27;
            uVar73 = *(long *)(lVar42 + 0xb8) - *(long *)(lVar42 + 0xb0);
            if ((long)uVar73 < 0) {
              uVar73 = 0xffffffffffffffff;
            }
            local_438._0_8_ =
                 _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                 super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
            ppaVar55 = (aiNode **)operator_new__(uVar73);
            memset(ppaVar55,0,uVar73);
            *(aiNode ***)
             ((long)_Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                    super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x458) = ppaVar55;
            puVar2 = *(undefined8 **)(lVar42 + 0xb8);
            for (puVar78 = *(undefined8 **)(lVar42 + 0xb0); puVar78 != puVar2; puVar78 = puVar78 + 1
                ) {
              pIVar53 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcObjectDefinition>
                                  ((LazyObject *)*puVar78);
              paVar45 = (aiNode *)
                        __dynamic_cast((_func_int *)
                                       ((long)&(pIVar53->super_IfcRoot).
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                               ._vptr_ObjectHelper +
                                       (long)(pIVar53->super_IfcRoot).
                                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>
                                             ._vptr_ObjectHelper[-3]),
                                       &Assimp::STEP::Object::typeinfo,
                                       &Assimp::IFC::Schema_2x3::IfcProduct::typeinfo);
              if ((paVar45 != (aiNode *)0x0) &&
                 (paVar45 = ProcessSpatialStructure
                                      ((anon_unknown_dwarf_e36d82 *)local_438._0_8_,paVar45,el,
                                       (ConversionData *)0x0,collect_openings),
                 paVar45 != (aiNode *)0x0)) {
                uVar41 = *(uint *)(local_438._0_8_ + 0x450);
                *(uint *)(local_438._0_8_ + 0x450) = uVar41 + 1;
                (*(aiNode ***)(local_438._0_8_ + 0x458))[uVar41] = paVar45;
              }
              _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
              super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
                   (tuple<aiNode_*,_std::default_delete<aiNode>_>)
                   (tuple<aiNode_*,_std::default_delete<aiNode>_>)local_438._0_8_;
            }
            auVar30._8_8_ = 0;
            auVar30._0_8_ = local_438._8_8_;
            local_438._0_16_ = auVar30 << 0x40;
            local_6f8._0_8_ =
                 _Var54._M_t.super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                 super__Head_base<0UL,_aiNode_*,_false>._M_head_impl;
            std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                      ((vector<aiNode*,std::allocator<aiNode*>> *)&local_778,(aiNode **)local_6f8);
            std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                      ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)local_438);
            _Var44._M_node = local_7d0._M_node;
          }
        }
        else {
          do {
            if (*(_Base_ptr *)(puVar66 + 0x20) >= p_Var63) {
              puVar68 = puVar66;
            }
            puVar66 = *(undefined1 **)
                       (puVar66 + (ulong)(*(_Base_ptr *)(puVar66 + 0x20) < p_Var63) * 8 + 0x10);
          } while (puVar66 != (undefined1 *)0x0);
          if ((puVar68 == puVar1) || (p_Var63 < *(_Base_ptr *)(puVar68 + 0x20))) goto LAB_004f63b4;
        }
        _Var52._M_node = (_Base_ptr)std::_Rb_tree_increment(local_7a8._M_node);
      } while (_Var52._M_node != _Var44._M_node);
    }
  }
  *(ConversionData **)&el[1].super_IfcObject.field_0x38 = local_560;
  if (local_560 == (ConversionData *)0x0) {
    *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> **)
     &el[1].super_IfcObject.field_0x30 = &local_578;
  }
  if ((char)local_70c == '\0') {
    if ((parent->mName).data[0xf4] == '\x01') {
      uVar41 = Assimp::IFC::ProcessMaterials
                         (*(uint64_t *)
                           ((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4),
                          0xffffffff,(ConversionData *)el,false);
      local_5a8._0_4_ = uVar41;
      local_520 = (_Base_ptr)(local_538 + 8);
      local_538._8_4_ = _S_red;
      local_528 = (_Base_ptr)0x0;
      local_510 = (_Base_ptr)0x0;
      local_518 = local_520;
      if ((parent->mName).data[0xf4] == '\0') {
        __assert_fail("have",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/./code/Step/STEPFile.h"
                      ,0x240,
                      "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>]"
                     );
      }
      pIVar56 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcProductRepresentation>
                          (*(LazyObject **)((parent->mName).data + 0xec));
      std::
      vector<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
      ::vector(&local_670,
               (long)(pIVar56->Representations).
                     super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     .
                     super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pIVar56->Representations).
                     super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     .
                     super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_438);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>const*,Assimp::IFC::Schema_2x3::IfcRepresentation_const**>
                ((pIVar56->Representations).
                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 .
                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pIVar56->Representations).
                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 .
                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentation>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_670.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      ppIVar34 = local_670.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar33 = local_670.
                 super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (local_670.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_670.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar80 = (long)local_670.
                       super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_670.
                       super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar73 = lVar80 >> 3;
        lVar42 = 0x3f;
        if (uVar73 != 0) {
          for (; uVar73 >> lVar42 == 0; lVar42 = lVar42 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                  (local_670.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_670.
                   super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar42 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar80 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (ppIVar33,ppIVar34);
        }
        else {
          p_Var57 = (_Base_ptr)((long)ppIVar33 + 0x80);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                    (ppIVar33,p_Var57);
          for (; p_Var57 != (_Base_ptr)ppIVar34; p_Var57 = (_Base_ptr)&p_Var57->_M_parent) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Assimp::IFC::Schema_2x3::IfcRepresentation_const**,std::vector<Assimp::IFC::Schema_2x3::IfcRepresentation_const*,std::allocator<Assimp::IFC::Schema_2x3::IfcRepresentation_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::RateRepresentationPredicate>>
                      (p_Var57);
          }
        }
      }
      local_7b0 = (_Base_ptr)
                  local_670.
                  super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_670.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_670.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var57 = (_Base_ptr)
                  local_670.
                  super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          while( true ) {
            _Var82._M_head_impl = *(aiNode **)(*(long *)p_Var57 + 0x68);
            local_598 = *(aiNode **)(*(long *)p_Var57 + 0x70);
            if (_Var82._M_head_impl == local_598) break;
            local_708 = (double)((ulong)local_708 & 0xffffffff00000000);
            local_7a8._M_node = p_Var57;
            do {
              pIVar58 = (IFC *)Assimp::STEP::LazyObject::
                               To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                         ((LazyObject *)*(aiString **)&(_Var82._M_head_impl)->mName)
              ;
              plVar43 = (long *)__dynamic_cast(pIVar58 + *(long *)(*(long *)pIVar58 + -0x18),
                                               &Assimp::STEP::Object::typeinfo,
                                               &Assimp::IFC::Schema_2x3::IfcMappedItem::typeinfo);
              if (plVar43 == (long *)0x0) {
                bVar83 = Assimp::IFC::ProcessRepresentationItem
                                   (pIVar58,(IfcRepresentationItem *)(ulong)(uint)local_5a8._0_4_,
                                    (uint)local_538,
                                    (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)el,(ConversionData *)collect_openings);
                local_708 = (double)CONCAT44(local_708._4_4_,
                                             CONCAT31((int3)((ulong)local_708 >> 8),
                                                      SUB81(local_708,0) | bVar83));
              }
              else {
                paVar45 = (aiNode *)operator_new(0x478);
                aiNode::aiNode(paVar45);
                (paVar45->mName).length = 0xd;
                builtin_strncpy((paVar45->mName).data,"IfcMappedItem",0xe);
                local_6f8._0_8_ = (aiNode *)0x3ff0000000000000;
                paStack_6e0 = (aiNode *)0x0;
                paStack_6d8 = (aiNode *)0x0;
                local_6f8._8_8_ = 0.0;
                p_Stack_6e8 = (_Base_ptr)0x0;
                local_6d0 = (pointer)0x3ff0000000000000;
                dStack_6b8 = 0.0;
                dStack_6b0 = 0.0;
                dStack_6c8 = 0.0;
                dStack_6c0 = 0.0;
                local_6a8 = 1.0;
                dStack_690 = 0.0;
                dStack_688 = 0.0;
                dStack_6a0 = 0.0;
                dStack_698 = 0.0;
                local_680 = 1.0;
                local_7a0._M_head_impl = paVar45;
                op = Assimp::STEP::LazyObject::
                     To<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>
                               ((LazyObject *)plVar43[5]);
                Assimp::IFC::ConvertTransformOperator((IfcMatrix4 *)local_6f8,op);
                local_658 = ZEXT816(0x3ff0000000000000);
                auStack_648 = ZEXT816(0);
                auStack_638 = (undefined1  [8])0x0;
                local_630 = (aiScene *)0x3ff0000000000000;
                local_618 = ZEXT816(0);
                local_628 = ZEXT816(0);
                local_608 = ZEXT816(0x3ff0000000000000);
                auStack_5f8 = ZEXT816(0);
                auStack_5e8 = (undefined1  [8])0x0;
                local_5e0 = 1.0;
                pIVar59 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                    ((LazyObject *)plVar43[4]);
                Assimp::IFC::ConvertAxisPlacement
                          ((IfcMatrix4 *)local_658,
                           *(IfcAxis2Placement **)
                            &(pIVar59->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>)
                             .field_0x10,(ConversionData *)el);
                paVar36 = local_630;
                auVar35 = auStack_638;
                uVar61 = local_658._0_8_;
                uVar22 = local_658._8_8_;
                uVar27 = local_618._0_8_;
                uVar37 = local_618._8_8_;
                dVar5 = (double)auStack_5f8._8_8_ * (double)paStack_6e0 +
                        (double)local_618._8_8_ * (double)p_Stack_6e8 +
                        (double)local_658._8_8_ * (double)local_6f8._0_8_ +
                        (double)local_6f8._8_8_ * (double)local_630;
                local_658._8_4_ = SUB84(dVar5,0);
                local_658._0_8_ =
                     (double)auStack_5f8._0_8_ * (double)paStack_6e0 +
                     (double)local_618._0_8_ * (double)p_Stack_6e8 +
                     (double)local_658._0_8_ * (double)local_6f8._0_8_ +
                     (double)local_6f8._8_8_ * (double)auStack_638;
                local_658._12_4_ = (int)((ulong)dVar5 >> 0x20);
                uVar23 = auStack_648._0_8_;
                uVar24 = auStack_648._8_8_;
                uVar25 = local_628._0_8_;
                uVar26 = local_628._8_8_;
                uVar38 = local_608._0_8_;
                uVar39 = local_608._8_8_;
                dVar5 = (double)paStack_6e0 * local_5e0 +
                        (double)p_Stack_6e8 * (double)local_608._8_8_ +
                        (double)local_6f8._0_8_ * (double)auStack_648._8_8_ +
                        (double)local_6f8._8_8_ * (double)local_628._8_8_;
                auStack_648._8_4_ = SUB84(dVar5,0);
                auStack_648._0_8_ =
                     (double)paStack_6e0 * (double)auStack_5e8 +
                     (double)p_Stack_6e8 * (double)local_608._0_8_ +
                     (double)local_6f8._0_8_ * (double)auStack_648._0_8_ +
                     (double)local_6f8._8_8_ * (double)local_628._0_8_;
                auStack_648._12_4_ = (int)((ulong)dVar5 >> 0x20);
                dVar5 = (double)auStack_5f8._8_8_ * dStack_6c0 +
                        (double)local_618._8_8_ * dStack_6c8 +
                        (double)uVar22 * (double)paStack_6d8 + (double)local_6d0 * (double)local_630
                ;
                unique0x10002874 = SUB84(dVar5,0);
                auStack_638 = (undefined1  [8])
                              ((double)auStack_5f8._0_8_ * dStack_6c0 +
                              (double)local_618._0_8_ * dStack_6c8 +
                              (double)uVar61 * (double)paStack_6d8 +
                              (double)local_6d0 * (double)auStack_638);
                unique0x10002878 = (int)((ulong)dVar5 >> 0x20);
                dVar5 = dStack_6c0 * local_5e0 +
                        dStack_6c8 * (double)local_608._8_8_ +
                        (double)paStack_6d8 * (double)uVar24 +
                        (double)local_6d0 * (double)local_628._8_8_;
                local_628._8_4_ = SUB84(dVar5,0);
                local_628._0_8_ =
                     dStack_6c0 * (double)auStack_5e8 +
                     dStack_6c8 * (double)local_608._0_8_ +
                     (double)paStack_6d8 * (double)uVar23 +
                     (double)local_6d0 * (double)local_628._0_8_;
                local_628._12_4_ = (int)((ulong)dVar5 >> 0x20);
                dVar5 = (double)auStack_5f8._8_8_ * dStack_6a0 +
                        (double)local_618._8_8_ * local_6a8 +
                        (double)uVar22 * dStack_6b8 + dStack_6b0 * (double)paVar36;
                local_618._8_4_ = SUB84(dVar5,0);
                local_618._0_8_ =
                     (double)auStack_5f8._0_8_ * dStack_6a0 +
                     (double)local_618._0_8_ * local_6a8 +
                     (double)uVar61 * dStack_6b8 + dStack_6b0 * (double)auVar35;
                local_618._12_4_ = (int)((ulong)dVar5 >> 0x20);
                dVar5 = dStack_6a0 * local_5e0 +
                        local_6a8 * (double)local_608._8_8_ +
                        dStack_6b8 * (double)uVar24 + dStack_6b0 * (double)uVar26;
                local_608._8_4_ = SUB84(dVar5,0);
                local_608._0_8_ =
                     dStack_6a0 * (double)auStack_5e8 +
                     local_6a8 * (double)local_608._0_8_ +
                     dStack_6b8 * (double)uVar23 + dStack_6b0 * (double)uVar25;
                local_608._12_4_ = (int)((ulong)dVar5 >> 0x20);
                dVar5 = (double)auStack_5f8._8_8_ * local_680 +
                        (double)uVar37 * dStack_688 +
                        (double)uVar22 * dStack_698 + (double)paVar36 * dStack_690;
                auStack_5f8._8_4_ = SUB84(dVar5,0);
                auStack_5f8._0_8_ =
                     (double)auStack_5f8._0_8_ * local_680 +
                     (double)uVar27 * dStack_688 +
                     (double)uVar61 * dStack_698 + (double)auVar35 * dStack_690;
                auStack_5f8._12_4_ = (int)((ulong)dVar5 >> 0x20);
                dVar5 = local_680 * local_5e0 +
                        dStack_688 * (double)uVar39 +
                        dStack_698 * (double)uVar24 + dStack_690 * (double)uVar26;
                unique0x100015c8 = SUB84(dVar5,0);
                auStack_5e8 = (undefined1  [8])
                              (local_680 * (double)auStack_5e8 +
                              dStack_688 * (double)uVar38 +
                              dStack_698 * (double)uVar23 + dStack_690 * (double)uVar25);
                unique0x100015cc = (int)((ulong)dVar5 >> 0x20);
                local_748._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     local_748._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
                local_748._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_748._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_748._M_impl.super__Rb_tree_header._M_header;
                local_748._M_impl.super__Rb_tree_header._M_node_count = 0;
                plVar3 = *(long **)&el[1].super_IfcObject.field_0x38;
                local_758 = (char *)0x0;
                if (plVar3 != (long *)0x0) {
                  local_758 = (char *)((plVar3[1] - *plVar3 >> 3) * 0x2e8ba2e8ba2e8ba3);
                }
                local_748._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_748._M_impl.super__Rb_tree_header._M_header._M_left;
                if (*(long *)&el[1].super_IfcObject.field_0x30 != 0) {
                  pdVar74 = (double *)local_658;
                  paVar75 = (aiMatrix4x4t<double> *)local_438;
                  for (lVar42 = 0x10; lVar42 != 0; lVar42 = lVar42 + -1) {
                    paVar75->a1 = *pdVar74;
                    pdVar74 = pdVar74 + (ulong)bVar84 * -2 + 1;
                    paVar75 = (aiMatrix4x4t<double> *)((long)paVar75 + (ulong)bVar84 * -0x10 + 8);
                  }
                  aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)local_438);
                  puVar78 = *(undefined8 **)&el[1].super_IfcObject.field_0x30;
                  pTVar79 = (TempOpening *)puVar78[1];
                  for (pTVar72 = (TempOpening *)*puVar78; pTVar72 != pTVar79; pTVar72 = pTVar72 + 1)
                  {
                    Assimp::IFC::TempOpening::Transform(pTVar72,(aiMatrix4x4t<double> *)local_438);
                  }
                }
                uVar41 = Assimp::IFC::ProcessMaterials
                                   (*(uint64_t *)((long)plVar43 + *(long *)(*plVar43 + -0x18) + 8),
                                    local_5a8._0_4_,(ConversionData *)el,false);
                local_7c8._M_head_impl = _Var82._M_head_impl;
                pIVar59 = Assimp::STEP::LazyObject::
                          To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                                    ((LazyObject *)plVar43[4]);
                pIVar60 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentation>
                                    (*(LazyObject **)
                                      &(pIVar59->
                                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                                       ).field_0x20);
                pLVar81 = (pIVar60->Items).
                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          .
                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pLVar4 = (pIVar60->Items).
                         super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                         .
                         super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (pLVar81 != pLVar4) {
                  uVar61 = 0;
                  do {
                    local_588 = (pointer)CONCAT44(local_588._4_4_,(int)uVar61);
                    while( true ) {
                      pIVar58 = (IFC *)Assimp::STEP::LazyObject::
                                       To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                                                 (pLVar81->obj);
                      bVar83 = Assimp::IFC::ProcessRepresentationItem
                                         (pIVar58,(IfcRepresentationItem *)(ulong)uVar41,
                                          (uint)&local_748,
                                          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                           *)el,(ConversionData *)collect_openings);
                      if (bVar83) break;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_558,
                                 *(char **)(pIVar58 + *(long *)(*(long *)pIVar58 + -0x18) + 0x10),
                                 &local_7d1);
                      collect_openings =
                           (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                            *)0x1f;
                      plVar43 = (long *)std::__cxx11::string::replace
                                                  ((ulong)local_558,0,(char *)0x0,0x6d305d);
                      local_5c8 = &local_5b8;
                      pdVar74 = (double *)(plVar43 + 2);
                      if ((double *)*plVar43 == pdVar74) {
                        local_5b8 = *pdVar74;
                        dStack_5b0 = (double)plVar43[3];
                      }
                      else {
                        local_5b8 = *pdVar74;
                        local_5c8 = (double *)*plVar43;
                      }
                      local_5c0 = (double)plVar43[1];
                      *plVar43 = (long)pdVar74;
                      plVar43[1] = 0;
                      *(undefined1 *)(plVar43 + 2) = 0;
                      plVar43 = (long *)std::__cxx11::string::append((char *)&local_5c8);
                      local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
                      psVar67 = (size_type *)(plVar43 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar43 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar67) {
                        local_798.field_2._M_allocated_capacity = *psVar67;
                        local_798.field_2._8_8_ = plVar43[3];
                      }
                      else {
                        local_798.field_2._M_allocated_capacity = *psVar67;
                        local_798._M_dataplus._M_p = (pointer)*plVar43;
                      }
                      local_798._M_string_length = plVar43[1];
                      *plVar43 = (long)psVar67;
                      plVar43[1] = 0;
                      *(undefined1 *)(plVar43 + 2) = 0;
                      Assimp::Formatter::
                      basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      basic_formatter<std::__cxx11::string>
                                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                  *)local_438,&local_798);
                      Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_438);
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
                      std::ios_base::~ios_base((ios_base *)auStack_3c8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_798._M_dataplus._M_p != &local_798.field_2) {
                        operator_delete(local_798._M_dataplus._M_p,
                                        local_798.field_2._M_allocated_capacity + 1);
                      }
                      if (local_5c8 != &local_5b8) {
                        operator_delete(local_5c8,(long)local_5b8 + 1);
                      }
                      if (local_558[0] != (_Base_ptr)local_548) {
                        operator_delete(local_558[0],local_548._0_8_ + 1);
                      }
                      pLVar81 = pLVar81 + 1;
                      if (pLVar81 == pLVar4) {
                        if (((ulong)local_588 & 1) == 0) goto LAB_004f7115;
                        goto LAB_004f6ea7;
                      }
                    }
                    pLVar81 = pLVar81 + 1;
                    uVar61 = CONCAT71(extraout_var,1);
                  } while (pLVar81 != pLVar4);
LAB_004f6ea7:
                  Assimp::IFC::AssignAddedMeshes
                            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&local_748,local_7a0._M_head_impl,(ConversionData *)el);
                  plVar43 = *(long **)&el[1].super_IfcObject.field_0x38;
                  if ((plVar43 != (long *)0x0) &&
                     (lVar42 = (plVar43[1] - *plVar43 >> 3) * 0x2e8ba2e8ba2e8ba3 - (long)local_758,
                     lVar42 != 0)) {
                    lVar80 = (long)local_758 * 0x58;
                    do {
                      Assimp::IFC::TempOpening::Transform
                                ((TempOpening *)
                                 (**(long **)&el[1].super_IfcObject.field_0x38 + lVar80),
                                 (IfcMatrix4 *)local_658);
                      lVar80 = lVar80 + 0x58;
                      lVar42 = lVar42 + -1;
                    } while (lVar42 != 0);
                  }
                  local_438._0_8_ = local_7a0._M_head_impl;
                  fVar6 = (this_00->mTransformation).a1;
                  fVar7 = (this_00->mTransformation).a2;
                  fVar8 = (this_00->mTransformation).a3;
                  fVar9 = (this_00->mTransformation).a4;
                  fVar10 = (this_00->mTransformation).b1;
                  fVar11 = (this_00->mTransformation).b2;
                  fVar12 = (this_00->mTransformation).b3;
                  fVar13 = (this_00->mTransformation).b4;
                  fVar85 = (float)(double)auStack_648._0_8_;
                  fVar88 = (float)(double)auStack_648._8_8_;
                  fVar14 = (this_00->mTransformation).c1;
                  fVar97 = (float)(double)local_658._0_8_;
                  fVar99 = (float)(double)local_658._8_8_;
                  fVar15 = (this_00->mTransformation).c2;
                  fVar91 = (float)(double)local_628._0_8_;
                  fVar93 = (float)(double)local_628._8_8_;
                  fVar16 = (this_00->mTransformation).c3;
                  fVar95 = (float)(double)auStack_638;
                  fVar96 = (float)(double)local_630;
                  local_758 = (char *)CONCAT44(fVar99,fVar97);
                  uStack_750 = (double)CONCAT44(fVar88,fVar85);
                  fVar86 = (float)(double)local_608._0_8_;
                  fVar89 = (float)(double)local_608._8_8_;
                  fVar92 = (float)(double)local_618._0_8_;
                  fVar94 = (float)(double)local_618._8_8_;
                  fVar98 = (float)(double)auStack_5e8;
                  fVar100 = (float)local_5e0;
                  fVar87 = (float)(double)auStack_5f8._0_8_;
                  fVar90 = (float)(double)auStack_5f8._8_8_;
                  fVar17 = (this_00->mTransformation).c4;
                  fVar18 = (this_00->mTransformation).d1;
                  fVar19 = (this_00->mTransformation).d2;
                  fVar20 = (this_00->mTransformation).d3;
                  fVar21 = (this_00->mTransformation).d4;
                  ((local_7a0._M_head_impl)->mTransformation).a1 =
                       fVar9 * fVar87 + fVar8 * fVar92 + fVar6 * fVar97 + fVar7 * fVar95;
                  ((local_7a0._M_head_impl)->mTransformation).a2 =
                       fVar9 * fVar90 + fVar8 * fVar94 + fVar6 * fVar99 + fVar7 * fVar96;
                  ((local_7a0._M_head_impl)->mTransformation).a3 =
                       fVar9 * fVar98 + fVar8 * fVar86 + fVar6 * fVar85 + fVar7 * fVar91;
                  ((local_7a0._M_head_impl)->mTransformation).a4 =
                       fVar9 * fVar100 + fVar8 * fVar89 + fVar6 * fVar88 + fVar7 * fVar93;
                  ((local_7a0._M_head_impl)->mTransformation).b1 =
                       fVar13 * fVar87 + fVar12 * fVar92 + fVar10 * fVar97 + fVar11 * fVar95;
                  ((local_7a0._M_head_impl)->mTransformation).b2 =
                       fVar13 * fVar90 + fVar12 * fVar94 + fVar10 * fVar99 + fVar11 * fVar96;
                  ((local_7a0._M_head_impl)->mTransformation).b3 =
                       fVar13 * fVar98 + fVar12 * fVar86 + fVar10 * fVar85 + fVar11 * fVar91;
                  ((local_7a0._M_head_impl)->mTransformation).b4 =
                       fVar13 * fVar100 + fVar12 * fVar89 + fVar10 * fVar88 + fVar11 * fVar93;
                  ((local_7a0._M_head_impl)->mTransformation).c1 =
                       fVar17 * fVar87 + fVar16 * fVar92 + fVar14 * fVar97 + fVar15 * fVar95;
                  ((local_7a0._M_head_impl)->mTransformation).c2 =
                       fVar17 * fVar90 + fVar16 * fVar94 + fVar14 * fVar99 + fVar15 * fVar96;
                  ((local_7a0._M_head_impl)->mTransformation).c3 =
                       fVar17 * fVar98 + fVar16 * fVar86 + fVar14 * fVar85 + fVar15 * fVar91;
                  ((local_7a0._M_head_impl)->mTransformation).c4 =
                       fVar17 * fVar100 + fVar16 * fVar89 + fVar14 * fVar88 + fVar15 * fVar93;
                  ((local_7a0._M_head_impl)->mTransformation).d1 =
                       fVar21 * fVar87 + fVar20 * fVar92 + fVar18 * fVar97 + fVar19 * fVar95;
                  ((local_7a0._M_head_impl)->mTransformation).d2 =
                       fVar21 * fVar90 + fVar20 * fVar94 + fVar18 * fVar99 + fVar19 * fVar96;
                  ((local_7a0._M_head_impl)->mTransformation).d3 =
                       fVar21 * fVar98 + fVar20 * fVar86 + fVar18 * fVar85 + fVar19 * fVar91;
                  ((local_7a0._M_head_impl)->mTransformation).d4 =
                       fVar21 * fVar100 + fVar20 * fVar89 + fVar18 * fVar88 + fVar19 * fVar93;
                  local_7a0._M_head_impl = (aiNode *)0x0;
                  ppaVar62 = std::vector<aiNode*,std::allocator<aiNode*>>::emplace_back<aiNode*>
                                       ((vector<aiNode*,std::allocator<aiNode*>> *)&local_778,
                                        (aiNode **)local_438);
                  local_708 = (double)CONCAT44(local_708._4_4_,
                                               (int)CONCAT71((int7)((ulong)ppaVar62 >> 8),1));
                }
LAB_004f7115:
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~_Rb_tree(&local_748);
                std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
                          ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_7a0);
                _Var82._M_head_impl = local_7c8._M_head_impl;
              }
              _Var82._M_head_impl = (aiNode *)(((_Var82._M_head_impl)->mName).data + 4);
            } while (_Var82._M_head_impl != local_598);
            p_Var57 = (_Base_ptr)&(local_7a8._M_node)->_M_parent;
            if (((ulong)local_708 & 1) != 0 || p_Var57 == local_7b0) goto LAB_004f71b5;
          }
          p_Var57 = (_Base_ptr)&p_Var57->_M_parent;
        } while (p_Var57 != local_7b0);
      }
LAB_004f71b5:
      Assimp::IFC::AssignAddedMeshes
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_538,this_00,(ConversionData *)el);
      if ((_Base_ptr)
          local_670.
          super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
        operator_delete(local_670.
                        super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_670.
                              super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_670.
                              super__Vector_base<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*,_std::allocator<const_Assimp::IFC::Schema_2x3::IfcRepresentation_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_538);
    }
    *(undefined8 *)&el[1].super_IfcObject.field_0x30 = 0;
    *(undefined8 *)&el[1].super_IfcObject.field_0x38 = 0;
  }
  iVar31._M_current = iStack_770._M_current;
  ppaVar55 = local_778;
  uVar73 = (long)iStack_770._M_current - (long)local_778;
  if (uVar73 != 0) {
    __n = 0xffffffffffffffff;
    if (-1 < (long)uVar73) {
      __n = uVar73;
    }
    __s_00 = (aiNode **)operator_new__(__n);
    memset(__s_00,0,__n);
    this_00->mChildren = __s_00;
    do {
      paVar45 = *ppaVar55;
      uVar41 = this_00->mNumChildren;
      this_00->mNumChildren = uVar41 + 1;
      this_00->mChildren[uVar41] = paVar45;
      paVar45->mParent = this_00;
      ppaVar55 = ppaVar55 + 1;
    } while (ppaVar55 != iVar31._M_current);
  }
  p_Var63 = *(_Base_ptr *)&el[1].super_IfcObject.field_0x50;
  if (p_Var63 != (_Base_ptr)0x0) {
    uVar73 = *(ulong *)((parent->mName).data + *(long *)(*(long *)&parent->mName + -0x18) + 4);
    __position._M_node = (_Base_ptr)&el[1].super_IfcObject.field_0x48;
    p_Var57 = __position._M_node;
    p_Var48 = p_Var63;
    do {
      if (*(ulong *)(p_Var48 + 1) >= uVar73) {
        p_Var57 = p_Var48;
      }
      p_Var48 = (&p_Var48->_M_left)[*(ulong *)(p_Var48 + 1) < uVar73];
    } while (p_Var48 != (_Base_ptr)0x0);
    if ((p_Var57 != __position._M_node) &&
       (p_Var69 = __position._M_node, *(ulong *)(p_Var57 + 1) <= uVar73)) {
      do {
        if (*(ulong *)(p_Var63 + 1) >= uVar73) {
          p_Var69 = p_Var63;
        }
        p_Var63 = (&p_Var63->_M_left)[*(ulong *)(p_Var63 + 1) < uVar73];
      } while (p_Var63 != (_Base_ptr)0x0);
      if ((p_Var69 != __position._M_node) && (*(ulong *)(p_Var69 + 1) <= uVar73)) {
        __position._M_node = p_Var69;
      }
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::erase_abi_cxx11_(local_5d8,__position);
      if (local_778 != (aiNode **)0x0) {
        operator_delete(local_778,(long)local_768 - (long)local_778);
      }
      std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
                (&local_578);
      return this_00;
    }
  }
  __assert_fail("conv.already_processed.find(el.GetID()) != conv.already_processed.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCLoader.cpp"
                ,0x365,
                "aiNode *(anonymous namespace)::ProcessSpatialStructure(aiNode *, const Schema_2x3::IfcProduct &, ConversionData &, std::vector<TempOpening> *)"
               );
}

Assistant:

aiNode* ProcessSpatialStructure(aiNode* parent, const Schema_2x3::IfcProduct& el, ConversionData& conv,
        std::vector<TempOpening>* collect_openings = nullptr ) {
    const STEP::DB::RefMap& refs = conv.db.GetRefs();

    // skip over space and annotation nodes - usually, these have no meaning in Assimp's context
    bool skipGeometry = false;
    if(conv.settings.skipSpaceRepresentations) {
        if(el.ToPtr<Schema_2x3::IfcSpace>()) {
            IFCImporter::LogDebug("skipping IfcSpace entity due to importer settings");
            skipGeometry = true;
        }
    }

    if(conv.settings.skipAnnotations) {
        if(el.ToPtr<Schema_2x3::IfcAnnotation>()) {
            IFCImporter::LogDebug("skipping IfcAnnotation entity due to importer settings");
            return nullptr;
        }
    }

    // add an output node for this spatial structure
    aiNode *nd(new aiNode );
    nd->mName.Set(el.GetClassName()+"_"+(el.Name?el.Name.Get():"Unnamed")+"_"+el.GlobalId);
    nd->mParent = parent;

    conv.already_processed.insert(el.GetID());

    // check for node metadata
    STEP::DB::RefMapRange children = refs.equal_range(el.GetID());
    if (children.first!=refs.end()) {
        Metadata properties;
        if (children.first==children.second) {
            // handles single property set
            ProcessMetadata((*children.first).second, conv, properties);
        } else {
            // handles multiple property sets (currently all property sets are merged,
            // which may not be the best solution in the long run)
            for (STEP::DB::RefMap::const_iterator it=children.first; it!=children.second; ++it) {
                ProcessMetadata((*it).second, conv, properties);
            }
        }

        if (!properties.empty()) {
            aiMetadata* data = aiMetadata::Alloc( static_cast<unsigned int>(properties.size()) );
            unsigned int index( 0 );
            for ( const Metadata::value_type& kv : properties ) {
                data->Set( index++, kv.first, aiString( kv.second ) );
            }
            nd->mMetaData = data;
        }
    }

    if(el.ObjectPlacement) {
        ResolveObjectPlacement(nd->mTransformation,el.ObjectPlacement.Get(),conv);
    }

    std::vector<TempOpening> openings;

    IfcMatrix4 myInv;
    bool didinv = false;

    // convert everything contained directly within this structure,
    // this may result in more nodes.
    std::vector< aiNode* > subnodes;
    try {
        // locate aggregates and 'contained-in-here'-elements of this spatial structure and add them in recursively
        // on our way, collect openings in *this* element
        STEP::DB::RefMapRange range = refs.equal_range(el.GetID());

        for(STEP::DB::RefMapRange range2 = range; range2.first != range.second; ++range2.first) {
            // skip over meshes that have already been processed before. This is strictly necessary
            // because the reverse indices also include references contained in argument lists and
            // therefore every element has a back-reference hold by its parent.
            if (conv.already_processed.find((*range2.first).second) != conv.already_processed.end()) {
                continue;
            }
            const STEP::LazyObject& obj = conv.db.MustGetObject((*range2.first).second);

            // handle regularly-contained elements
            if(const Schema_2x3::IfcRelContainedInSpatialStructure* const cont = obj->ToPtr<Schema_2x3::IfcRelContainedInSpatialStructure>()) {
                if(cont->RelatingStructure->GetID() != el.GetID()) {
                    continue;
                }
                for(const Schema_2x3::IfcProduct& pro : cont->RelatedElements) {
                    if(pro.ToPtr<Schema_2x3::IfcOpeningElement>()) {
                        // IfcOpeningElement is handled below. Sadly we can't use it here as is:
                        // The docs say that opening elements are USUALLY attached to building storey,
                        // but we want them for the building elements to which they belong.
                        continue;
                    }

                    aiNode* const ndnew = ProcessSpatialStructure(nd,pro,conv,nullptr);
                    if(ndnew) {
                        subnodes.push_back( ndnew );
                    }
                }
            }
            // handle openings, which we collect in a list rather than adding them to the node graph
            else if(const Schema_2x3::IfcRelVoidsElement* const fills = obj->ToPtr<Schema_2x3::IfcRelVoidsElement>()) {
                if(fills->RelatingBuildingElement->GetID() == el.GetID()) {
                    const Schema_2x3::IfcFeatureElementSubtraction& open = fills->RelatedOpeningElement;

                    // move opening elements to a separate node since they are semantically different than elements that are just 'contained'
                    std::unique_ptr<aiNode> nd_aggr(new aiNode());
                    nd_aggr->mName.Set("$RelVoidsElement");
                    nd_aggr->mParent = nd;

                    nd_aggr->mTransformation = nd->mTransformation;

                    std::vector<TempOpening> openings_local;
                    aiNode* const ndnew = ProcessSpatialStructure( nd_aggr.get(),open, conv,&openings_local);
                    if (ndnew) {

                        nd_aggr->mNumChildren = 1;
                        nd_aggr->mChildren = new aiNode*[1]();


                        nd_aggr->mChildren[0] = ndnew;

                        if(openings_local.size()) {
                            if (!didinv) {
                                myInv = aiMatrix4x4(nd->mTransformation ).Inverse();
                                didinv = true;
                            }

                            // we need all openings to be in the local space of *this* node, so transform them
                            for(TempOpening& op :openings_local) {
                                op.Transform( myInv*nd_aggr->mChildren[0]->mTransformation);
                                openings.push_back(op);
                            }
                        }
                        subnodes.push_back( nd_aggr.release() );
                    }
                }
            }
        }

        for(;range.first != range.second; ++range.first) {
            // see note in loop above
            if (conv.already_processed.find((*range.first).second) != conv.already_processed.end()) {
                continue;
            }
            if(const Schema_2x3::IfcRelAggregates* const aggr = conv.db.GetObject((*range.first).second)->ToPtr<Schema_2x3::IfcRelAggregates>()) {
                if(aggr->RelatingObject->GetID() != el.GetID()) {
                    continue;
                }

                // move aggregate elements to a separate node since they are semantically different than elements that are just 'contained'
                std::unique_ptr<aiNode> nd_aggr(new aiNode());
                nd_aggr->mName.Set("$RelAggregates");
                nd_aggr->mParent = nd;

                nd_aggr->mTransformation = nd->mTransformation;

                nd_aggr->mChildren = new aiNode*[aggr->RelatedObjects.size()]();
                for(const Schema_2x3::IfcObjectDefinition& def : aggr->RelatedObjects) {
                    if(const Schema_2x3::IfcProduct* const prod = def.ToPtr<Schema_2x3::IfcProduct>()) {

                        aiNode* const ndnew = ProcessSpatialStructure(nd_aggr.get(),*prod,conv,NULL);
                        if(ndnew) {
                            nd_aggr->mChildren[nd_aggr->mNumChildren++] = ndnew;
                        }
                    }
                }

                subnodes.push_back( nd_aggr.release() );
            }
        }

        conv.collect_openings = collect_openings;
        if(!conv.collect_openings) {
            conv.apply_openings = &openings;
        }

        if (!skipGeometry) {
          ProcessProductRepresentation(el, nd, subnodes, conv);
          conv.apply_openings = conv.collect_openings = nullptr;
        }

        if (subnodes.size()) {
            nd->mChildren = new aiNode*[subnodes.size()]();
            for(aiNode* nd2 : subnodes) {
                nd->mChildren[nd->mNumChildren++] = nd2;
                nd2->mParent = nd;
            }
        }
    } catch(...) {
        // it hurts, but I don't want to pull boost::ptr_vector into -noboost only for these few spots here
        std::for_each(subnodes.begin(),subnodes.end(),delete_fun<aiNode>());
        throw;
    }

    ai_assert(conv.already_processed.find(el.GetID()) != conv.already_processed.end());
    conv.already_processed.erase(conv.already_processed.find(el.GetID()));
    return nd;
}